

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoSimdShuffle(Thread *this,Instr instr)

{
  byte bVar1;
  u8 i;
  long lVar2;
  undefined1 *puVar3;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Value local_48;
  Value local_38;
  Value local_28;
  u64 local_18;
  undefined8 uStack_10;
  
  local_18 = instr.field_2.imm_u64;
  uStack_10 = instr.field_2._8_8_;
  local_28 = Pop(this);
  local_38 = Pop(this);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    bVar1 = *(byte *)((long)&local_18 + lVar2);
    puVar3 = (undefined1 *)((long)&local_28 + (ulong)(bVar1 - 0x10));
    if (bVar1 < 0x10) {
      puVar3 = (undefined1 *)((long)&local_38 + (ulong)bVar1);
    }
    *(undefined1 *)((long)&local_48 + lVar2) = *puVar3;
  }
  Push(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShuffle(Instr instr) {
  using S = u8x16;
  auto sel = Bitcast<S>(instr.imm_v128);
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] =
        sel.v[i] < S::lanes ? lhs.v[sel.v[i]] : rhs.v[sel.v[i] - S::lanes];
  }
  Push(result);
  return RunResult::Ok;
}